

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

string * __thiscall
wabt::Token::to_string_clamp_abi_cxx11_
          (string *__return_storage_ptr__,Token *this,size_t max_length)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string s;
  
  to_string_abi_cxx11_((string *)local_40,this);
  if (max_length < s._M_dataplus._M_p) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)local_40);
    std::operator+(__return_storage_ptr__,&local_60,"...");
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_40 == (undefined1  [8])&s._M_string_length) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length);
      *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length);
    }
    __return_storage_ptr__->_M_string_length = (size_type)s._M_dataplus._M_p;
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length._0_1_ = 0;
    local_40 = (undefined1  [8])&s._M_string_length;
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string_clamp(size_t max_length) const {
  std::string s = to_string();
  if (s.length() > max_length) {
    return s.substr(0, max_length - 3) + "...";
  } else {
    return s;
  }
}